

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool readArguments(int argc,char ***argv)

{
  size_t sVar1;
  OptionValue *pOVar2;
  ostream *poVar3;
  bool bVar4;
  ParseResult result;
  Options options;
  allocator<char> local_2e4;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  int local_29c;
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  shared_ptr<const_cxxopts::Value> local_288;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  ParseResult local_1f8;
  Options local_138;
  
  local_29c = argc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"approx",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Test transcendental function approximations",
             (allocator<char> *)&local_2e0);
  cxxopts::Options::Options(&local_138,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  local_138.m_allow_unrecognised = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"h,help",&local_2e2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"Print help",&local_2e3);
  cxxopts::value<bool>();
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_298;
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_290._M_pi;
  local_298 = (element_type *)0x0;
  _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_2e4);
  cxxopts::Option::Option((Option *)&local_1f8,&local_2c0,&local_258,&local_288,&local_278);
  cxxopts::Options::add_option(&local_138,&local_2e0,(Option *)&local_1f8);
  cxxopts::Option::~Option((Option *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_290);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"p,plot",&local_2e2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Plot results using GNUplot. Supported: \"pdf\" or \"html\"",
             &local_2e3);
  cxxopts::value<std::__cxx11::string>();
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_298;
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_290._M_pi;
  local_298 = (element_type *)0x0;
  _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_2e4);
  cxxopts::Option::Option((Option *)&local_1f8,&local_2c0,&local_258,&local_288,&local_278);
  cxxopts::Options::add_option(&local_138,&local_2e0,(Option *)&local_1f8);
  cxxopts::Option::~Option((Option *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_290);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"f,function",&local_2e2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Name of function to test. Supported: \"expf\", \"log10f\", \"invsqrtf\", \"sqrti\", \"sqrtf\" or \"atan2f\""
             ,&local_2e3);
  cxxopts::value<std::__cxx11::string>();
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_298;
  local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_290._M_pi;
  local_298 = (element_type *)0x0;
  _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_2e4);
  cxxopts::Option::Option((Option *)&local_1f8,&local_2c0,&local_258,&local_288,&local_278);
  cxxopts::Options::add_option(&local_138,&local_2e0,(Option *)&local_1f8);
  cxxopts::Option::~Option((Option *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_290);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  cxxopts::Options::parse(&local_1f8,&local_138,&local_29c,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"help",(allocator<char> *)&local_2c0);
  sVar1 = cxxopts::ParseResult::count(&local_1f8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"function",(allocator<char> *)&local_2c0);
    sVar1 = cxxopts::ParseResult::count(&local_1f8,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    if (sVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"function",(allocator<char> *)&local_2c0);
      pOVar2 = cxxopts::ParseResult::operator[](&local_1f8,&local_2e0);
      cxxopts::OptionValue::as<std::__cxx11::string>(pOVar2);
      std::__cxx11::string::_M_assign((string *)&m_approxFunc_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"plot",(allocator<char> *)&local_2c0);
      sVar1 = cxxopts::ParseResult::count(&local_1f8,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      bVar4 = true;
      if (sVar1 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"plot",(allocator<char> *)&local_2c0);
        pOVar2 = cxxopts::ParseResult::operator[](&local_1f8,&local_2e0);
        cxxopts::OptionValue::as<std::__cxx11::string>(pOVar2);
        std::__cxx11::string::_M_assign((string *)&m_plotFormat_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
      goto LAB_00150b89;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"No function name passed!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  bVar4 = false;
LAB_00150b89:
  cxxopts::ParseResult::~ParseResult(&local_1f8);
  cxxopts::Options::~Options(&local_138);
  return bVar4;
}

Assistant:

bool readArguments(int argc, char**& argv)
{
    cxxopts::Options options("approx", "Test transcendental function approximations");
    options.allow_unrecognised_options();
    options.add_option("", {"h,help", "Print help"});
    options.add_option("", {"p,plot", "Plot results using GNUplot. Supported: \"pdf\" or \"html\"", cxxopts::value<std::string>()});
    options.add_option("", {"f,function", "Name of function to test. Supported: \"expf\", \"log10f\", \"invsqrtf\", \"sqrti\", \"sqrtf\" or \"atan2f\"", cxxopts::value<std::string>()});
    auto result = options.parse(argc, argv);
    // check if help was requested
    if (result.count("help"))
    {
        return false;
    }
    // check if a function was specified
    if (result.count("function"))
    {
        m_approxFunc = result["function"].as<std::string>();
    }
    else
    {
        std::cout << "No function name passed!" << std::endl;
        return false;
    }
    if (result.count("plot"))
    {
        m_plotFormat = result["plot"].as<std::string>();
    }
    return true;
}